

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

Nullable<const_crc_internal::CrcCordState_*> __thiscall
absl::lts_20240722::Cord::MaybeGetCrcCordState(Cord *this)

{
  CordRep *pCVar1;
  Nullable<const_crc_internal::CrcCordState_*> pCVar2;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    return (Nullable<const_crc_internal::CrcCordState_*>)0x0;
  }
  pCVar1 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  pCVar2 = (Nullable<const_crc_internal::CrcCordState_*>)0x0;
  if (pCVar1->tag == '\x02') {
    pCVar2 = (Nullable<const_crc_internal::CrcCordState_*>)&pCVar1[1].refcount;
  }
  return pCVar2;
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }